

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O0

int next_proto_cb(SSL *param_1,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  bool bVar1;
  int iVar2;
  uchar **in_RCX;
  undefined4 in_R8D;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_R9;
  long in_FS_OFFSET;
  int proto;
  NPNContext *ctx;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *file;
  undefined4 in_stack_ffffffffffffffa0;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_R9;
  iVar2 = q_SSL_select_next_proto
                    (in_RCX,(uchar *)CONCAT44(in_R8D,in_stack_ffffffffffffffa0),(uchar *)in_R9,
                     (uint)((ulong)in_R9 >> 0x20),
                     (uchar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  if (iVar2 == 0) {
    *(undefined4 *)&in_R9->field_0xc = 0;
  }
  else if (iVar2 == 1) {
    *(undefined4 *)&in_R9->field_0xc = 1;
  }
  else if (iVar2 == 2) {
    *(undefined4 *)&in_R9->field_0xc = 2;
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    iVar3 = iVar2;
    lcTlsBackend();
    anon_unknown.dwarf_142f1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_R9,(QLoggingCategory *)CONCAT44(iVar3,iVar2));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_142f1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x15f9bc);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_R8D,in_stack_ffffffffffffffa0),(char *)file,
                 (int)((ulong)in_R9 >> 0x20),(char *)CONCAT44(iVar3,iVar2),(char *)0x15f9d2);
      QMessageLogger::warning(local_38,"OpenSSL sent unknown NPN status");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int next_proto_cb(SSL *, unsigned char **out, unsigned char *outlen,
                         const unsigned char *in, unsigned int inlen, void *arg)
{
    QSslContext::NPNContext *ctx = reinterpret_cast<QSslContext::NPNContext *>(arg);

    // comment out to debug:
//    QList<QByteArray> supportedVersions;
//    for (unsigned int i = 0; i < inlen; ) {
//        QByteArray version(reinterpret_cast<const char *>(&in[i+1]), in[i]);
//        supportedVersions << version;
//        i += in[i] + 1;
//    }

    int proto = q_SSL_select_next_proto(out, outlen, in, inlen, ctx->data, ctx->len);
    switch (proto) {
    case OPENSSL_NPN_UNSUPPORTED:
        ctx->status = QSslConfiguration::NextProtocolNegotiationNone;
        break;
    case OPENSSL_NPN_NEGOTIATED:
        ctx->status = QSslConfiguration::NextProtocolNegotiationNegotiated;
        break;
    case OPENSSL_NPN_NO_OVERLAP:
        ctx->status = QSslConfiguration::NextProtocolNegotiationUnsupported;
        break;
    default:
        qCWarning(lcTlsBackend, "OpenSSL sent unknown NPN status");
    }

    return SSL_TLSEXT_ERR_OK;
}